

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O0

uint * Raig_ManSimRef(Raig_Man_t *p,int i)

{
  uint *puVar1;
  uint *local_38;
  uint local_2c;
  int *piStack_28;
  uint Ent;
  uint *pPlace;
  uint *pSim;
  int i_local;
  Raig_Man_t *p_local;
  
  if (i < 2) {
    __assert_fail("i > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                  ,0xe6,"unsigned int *Raig_ManSimRef(Raig_Man_t *, int)");
  }
  if (p->pSims[i] == 0) {
    if (p->MemFree == 0) {
      if (p->nWordsAlloc == 0) {
        if (p->pMems != (uint *)0x0) {
          __assert_fail("p->pMems == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                        ,0xed,"unsigned int *Raig_ManSimRef(Raig_Man_t *, int)");
        }
        p->nWordsAlloc = 0x20000;
        p->nMems = 1;
      }
      p->nWordsAlloc = p->nWordsAlloc << 1;
      if (p->pMems == (uint *)0x0) {
        local_38 = (uint *)malloc((long)p->nWordsAlloc << 2);
      }
      else {
        local_38 = (uint *)realloc(p->pMems,(long)p->nWordsAlloc << 2);
      }
      p->pMems = local_38;
      memset(p->pMems,0xff,(long)(p->nWords + 1) << 2);
      piStack_28 = &p->MemFree;
      for (local_2c = p->nMems * (p->nWords + 1); local_2c + p->nWords + 1 < (uint)p->nWordsAlloc;
          local_2c = p->nWords + 1 + local_2c) {
        *piStack_28 = local_2c;
        piStack_28 = (int *)(p->pMems + local_2c);
      }
      *piStack_28 = 0;
    }
    p->pSims[i] = p->MemFree;
    puVar1 = p->pMems + p->MemFree;
    p->MemFree = *puVar1;
    *puVar1 = p->pRefs[i];
    p->nMems = p->nMems + 1;
    if (p->nMemsMax < p->nMems) {
      p->nMemsMax = p->nMems;
    }
    return puVar1;
  }
  __assert_fail("p->pSims[i] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                ,0xe7,"unsigned int *Raig_ManSimRef(Raig_Man_t *, int)");
}

Assistant:

unsigned * Raig_ManSimRef( Raig_Man_t * p, int i )
{
    unsigned * pSim;
    assert( i > 1 );
    assert( p->pSims[i] == 0 );
    if ( p->MemFree == 0 )
    {
        unsigned * pPlace, Ent;
        if ( p->nWordsAlloc == 0 )
        {
            assert( p->pMems == NULL );
            p->nWordsAlloc = (1<<17); // -> 1Mb
            p->nMems = 1;
        }
        p->nWordsAlloc *= 2;
        p->pMems = ABC_REALLOC( unsigned, p->pMems, p->nWordsAlloc );
        memset( p->pMems, 0xff, sizeof(unsigned) * (p->nWords + 1) );
        pPlace = (unsigned *)&p->MemFree;
        for ( Ent = p->nMems * (p->nWords + 1); 
              Ent + p->nWords + 1 < (unsigned)p->nWordsAlloc; 
              Ent += p->nWords + 1 )
        {
            *pPlace = Ent;
            pPlace = p->pMems + Ent;
        }
        *pPlace = 0;
    }
    p->pSims[i] = p->MemFree;
    pSim = p->pMems + p->MemFree;
    p->MemFree = pSim[0];
    pSim[0] = p->pRefs[i];
    p->nMems++;
    if ( p->nMemsMax < p->nMems )
        p->nMemsMax = p->nMems;
    return pSim;
}